

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::AsyncifyAssertInNonInstrumented::runOnFunction
          (AsyncifyAssertInNonInstrumented *this,Module *module_,Function *func)

{
  AsyncifyBuilder *this_00;
  bool bVar1;
  Index index;
  GlobalGet *value;
  LocalSet *left;
  Block *pBVar2;
  Table *pTVar3;
  Name name;
  pointer local_128;
  pointer puStack_120;
  pointer local_78;
  pointer pTStack_70;
  pointer local_68;
  Function *pFStack_60;
  Module *local_58;
  Function *local_50;
  pointer local_48;
  Index local_40;
  pointer local_38;
  
  bVar1 = ModuleAnalyzer::needsInstrumentation(this->analyzer,func);
  if (!bVar1) {
    this->module = module_;
    std::
    make_unique<wasm::(anonymous_namespace)::AsyncifyBuilder,wasm::Module&,wasm::Type&,wasm::Name&>
              ((Module *)&stack0xfffffffffffffed8,(Type *)module_,(Name *)&this->pointerType);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ::operator=(&this->builder,
                (unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                 *)&stack0xfffffffffffffed8);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                   *)&stack0xfffffffffffffed8);
    index = Builder::addVar(func,(Type)0x2);
    this_00 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
              _M_head_impl;
    name.super_IString.str._M_str = DAT_00e63520;
    name.super_IString.str._M_len = wasm::(anonymous_namespace)::ASYNCIFY_STATE;
    value = Builder::makeGlobalGet(&this_00->super_Builder,name,(Type)0x2);
    left = Builder::makeLocalSet(&this_00->super_Builder,index,(Expression *)value);
    local_38 = (pointer)&func->body;
    pBVar2 = Builder::makeSequence(&this_00->super_Builder,(Expression *)left,func->body);
    func->body = (Expression *)pBVar2;
    local_128 = (pointer)0x0;
    puStack_120 = (pointer)0x0;
    local_78 = (pointer)0x0;
    pTStack_70 = (pointer)0x0;
    local_68 = (pointer)0x0;
    pFStack_60 = (Function *)0x0;
    local_58 = (Module *)0x0;
    local_48 = (pointer)(this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                        .
                        super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                        ._M_head_impl;
    local_50 = func;
    local_40 = index;
    Walker<Walker,_wasm::Visitor<Walker,_void>_>::pushTask
              ((Walker<Walker,_wasm::Visitor<Walker,_void>_> *)&stack0xfffffffffffffed8,
               PostWalker<Walker,_wasm::Visitor<Walker,_void>_>::scan,(Expression **)local_38);
    while( true ) {
      if ((long)&(puStack_120->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl +
          ((long)pTStack_70 - (long)local_78 >> 4) == 0) break;
      if (local_78 == pTStack_70) {
        if (puStack_120 == (pointer)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                        ,0x5a,
                        "T &wasm::SmallVector<wasm::Walker<Walker, wasm::Visitor<Walker>>::Task, 10>::back() [T = wasm::Walker<Walker, wasm::Visitor<Walker>>::Task, N = 10]"
                       );
        }
        puStack_120 = (pointer)((long)&puStack_120[-1]._M_t.
                                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                       .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl +
                               7);
        pTVar3 = *(Table **)(&stack0xfffffffffffffee8 + (long)puStack_120 * 0x10);
        local_128 = *(pointer *)(&stack0xfffffffffffffef0 + (long)puStack_120 * 0x10);
      }
      else {
        pTVar3 = (((__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true> *)
                  &pTStack_70[-1].func)->
                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)._M_t.
                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                 super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        local_128 = (pointer)pTStack_70[-1].currp;
        pTStack_70 = pTStack_70 + -1;
      }
      if ((local_128->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
          super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl == (Export *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                      ,0x139,
                      "void wasm::Walker<Walker, wasm::Visitor<Walker>>::walk(Expression *&) [SubType = Walker, VisitorType = wasm::Visitor<Walker>]"
                     );
      }
      (*(code *)pTVar3)(&stack0xfffffffffffffed8);
    }
    Walker<Walker,_wasm::Visitor<Walker,_void>_>::~Walker
              ((Walker<Walker,_wasm::Visitor<Walker,_void>_> *)&stack0xfffffffffffffed8);
  }
  return;
}

Assistant:

void runOnFunction(Module* module_, Function* func) override {
    // FIXME: This looks like it was never right, as it should ignore the top-
    //        most runtime, but it will actually instrument it (as it needs no
    //        instrumentation, like random code - but the top-most runtime is
    //        actually a place that needs neither instrumentation *nor*
    //        assertions, as the assertions will error when it changes the
    //        state).
    if (!analyzer->needsInstrumentation(func)) {
      module = module_;
      builder =
        std::make_unique<AsyncifyBuilder>(*module, pointerType, asyncifyMemory);
      addAssertsInNonInstrumented(func);
    }
  }